

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O0

void __thiscall CLI::IsMember::IsMember<int>(IsMember *this,initializer_list<int> values)

{
  initializer_list<int> __l;
  allocator<int> local_49;
  IsMember *local_48;
  iterator piStack_40;
  vector<int,_std::allocator<int>_> local_38;
  IsMember *local_20;
  IsMember *this_local;
  initializer_list<int> values_local;
  
  piStack_40 = (iterator)values._M_len;
  local_48 = (IsMember *)values._M_array;
  local_20 = this;
  this_local = local_48;
  values_local._M_array = piStack_40;
  std::allocator<int>::allocator(&local_49);
  __l._M_len = (size_type)piStack_40;
  __l._M_array = (iterator)local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_38,__l,&local_49);
  IsMember<std::vector<int,std::allocator<int>>>(this,&local_38);
  std::vector<int,_std::allocator<int>_>::~vector(&local_38);
  std::allocator<int>::~allocator(&local_49);
  return;
}

Assistant:

IsMember(std::initializer_list<T> values, Args &&...args)
        : IsMember(std::vector<T>(values), std::forward<Args>(args)...) {}